

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O2

OwningStringMap<unsigned_long,_std::map<duckdb::string_t,_unsigned_long,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
* duckdb::
  StringMapType<duckdb::OwningStringMap<unsigned_long,_std::map<duckdb::string_t,_unsigned_long,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>_>
  ::CreateEmpty(ArenaAllocator *allocator)

{
  _Rb_tree_header *p_Var1;
  OwningStringMap<unsigned_long,_std::map<duckdb::string_t,_unsigned_long,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
  *pOVar2;
  
  pOVar2 = (OwningStringMap<unsigned_long,_std::map<duckdb::string_t,_unsigned_long,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
            *)operator_new(0x40);
  pOVar2->allocator = &allocator->arena_allocator;
  p_Var1 = &(pOVar2->map)._M_t._M_impl.super__Rb_tree_header;
  (pOVar2->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pOVar2->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pOVar2->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (pOVar2->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (pOVar2->map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pOVar2->free_type = DOES_NOT_REQUIRE_FREE;
  return pOVar2;
}

Assistant:

static TYPE *CreateEmpty(ArenaAllocator &allocator) {
		return new TYPE(allocator);
	}